

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_set_negotiated_protocol(ptls_t *tls,char *protocol,size_t protocol_len)

{
  size_t local_40;
  char *local_30;
  char *duped;
  size_t protocol_len_local;
  char *protocol_local;
  ptls_t *tls_local;
  
  local_30 = (char *)0x0;
  if (protocol != (char *)0x0) {
    local_40 = protocol_len;
    if (protocol_len == 0) {
      local_40 = strlen(protocol);
    }
    local_30 = duplicate_as_str(protocol,local_40);
    if (local_30 == (char *)0x0) {
      return 0x201;
    }
  }
  free(tls->negotiated_protocol);
  tls->negotiated_protocol = local_30;
  return 0;
}

Assistant:

int ptls_set_negotiated_protocol(ptls_t *tls, const char *protocol, size_t protocol_len)
{
    char *duped = NULL;

    if (protocol != NULL && (duped = duplicate_as_str(protocol, protocol_len != 0 ? protocol_len : strlen(protocol))) == NULL)
        return PTLS_ERROR_NO_MEMORY;

    free(tls->negotiated_protocol);
    tls->negotiated_protocol = duped;

    return 0;
}